

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O2

void __thiscall FMD3Model::BuildVertexBuffer(FMD3Model *this)

{
  float *pfVar1;
  undefined8 uVar2;
  MD3TexCoord MVar3;
  int iVar4;
  MD3Surface *pMVar5;
  MD3Triangle *pMVar6;
  ulong uVar7;
  FModelVertexBuffer *this_00;
  FModelVertex *pFVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int i;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  if ((this->super_FModel).mVBuf != (FModelVertexBuffer *)0x0) {
    return;
  }
  LoadGeometry(this);
  iVar4 = this->numFrames;
  uVar7 = 0;
  uVar16 = (ulong)(uint)this->numSurfaces;
  if (this->numSurfaces < 1) {
    uVar16 = uVar7;
  }
  uVar13 = 0;
  uVar17 = 0;
  for (; uVar16 * 0x38 - uVar7 != 0; uVar7 = uVar7 + 0x38) {
    uVar17 = uVar17 + *(int *)((long)&this->surfaces->numVertices + uVar7) * iVar4;
    uVar13 = uVar13 + *(int *)((long)&this->surfaces->numTriangles + uVar7) * 3;
  }
  this_00 = (FModelVertexBuffer *)operator_new(0x28);
  FModelVertexBuffer::FModelVertexBuffer(this_00,true,iVar4 == 1);
  (this->super_FModel).mVBuf = this_00;
  pFVar8 = FModelVertexBuffer::LockVertexBuffer(this_00,uVar17);
  puVar9 = FModelVertexBuffer::LockIndexBuffer((this->super_FModel).mVBuf,uVar13);
  if ((pFVar8 != (FModelVertex *)0x0) && (puVar9 != (uint *)0x0)) {
    uVar13 = 0;
    uVar16 = 0;
    for (lVar14 = 0; lVar14 < this->numSurfaces; lVar14 = lVar14 + 1) {
      pMVar5 = this->surfaces;
      pMVar5[lVar14].vindex = (uint)uVar16;
      pMVar5[lVar14].iindex = uVar13;
      iVar4 = pMVar5[lVar14].numVertices;
      uVar17 = this->numFrames * iVar4;
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      pMVar5 = pMVar5 + lVar14;
      lVar15 = 4;
      for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
        uVar10 = uVar7 + (uVar16 & 0xffffffff) & 0xffffffff;
        uVar2 = *(undefined8 *)((long)&pMVar5->vertices->x + lVar15);
        MVar3 = pMVar5->texcoords
                [(long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                 (long)iVar4 & 0xffffffff];
        pFVar8[uVar10].x = *(float *)((long)pMVar5->vertices + lVar15 + -4);
        pfVar1 = &pFVar8[uVar10].y;
        *pfVar1 = (float)((ulong)uVar2 >> 0x20);
        pfVar1[1] = (float)uVar2;
        pfVar1[2] = MVar3.s;
        pfVar1[3] = MVar3.t;
        lVar15 = lVar15 + 0x18;
      }
      uVar16 = (uVar16 & 0xffffffff) + uVar7;
      lVar15 = 0;
      for (lVar11 = 0; lVar11 < pMVar5->numTriangles; lVar11 = lVar11 + 1) {
        pMVar6 = pMVar5->tris;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          puVar9[(ulong)uVar13 + lVar12 & 0xffffffff] =
               *(uint *)((long)pMVar6->VertIndex + lVar12 * 4 + lVar15);
        }
        lVar15 = lVar15 + 0xc;
        uVar13 = uVar13 + 3;
      }
      MD3Surface::UnloadGeometry(pMVar5);
    }
    FModelVertexBuffer::UnlockVertexBuffer((this->super_FModel).mVBuf);
    FModelVertexBuffer::UnlockIndexBuffer((this->super_FModel).mVBuf);
    return;
  }
  __assert_fail("vertptr != nullptr && indxptr != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/models/gl_models_md3.cpp"
                ,0x114,"virtual void FMD3Model::BuildVertexBuffer()");
}

Assistant:

void FMD3Model::BuildVertexBuffer()
{
	if (mVBuf == nullptr)
	{
		LoadGeometry();

		unsigned int vbufsize = 0;
		unsigned int ibufsize = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];
			vbufsize += numFrames * surf->numVertices;
			ibufsize += 3 * surf->numTriangles;
		}

		mVBuf = new FModelVertexBuffer(true, numFrames == 1);
		FModelVertex *vertptr = mVBuf->LockVertexBuffer(vbufsize);
		unsigned int *indxptr = mVBuf->LockIndexBuffer(ibufsize);

		assert(vertptr != nullptr && indxptr != nullptr);

		unsigned int vindex = 0, iindex = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];

			surf->vindex = vindex;
			surf->iindex = iindex;
			for (int j = 0; j < numFrames * surf->numVertices; j++)
			{
				MD3Vertex* vert = surf->vertices + j;

				FModelVertex *bvert = &vertptr[vindex++];

				int tc = j % surf->numVertices;
				bvert->Set(vert->x, vert->z, vert->y, surf->texcoords[tc].s, surf->texcoords[tc].t);
				bvert->SetNormal(vert->nx, vert->nz, vert->ny);
			}

			for (int k = 0; k < surf->numTriangles; k++)
			{
				for (int l = 0; l < 3; l++)
				{
					indxptr[iindex++] = surf->tris[k].VertIndex[l];
				}
			}
			surf->UnloadGeometry();
		}
		mVBuf->UnlockVertexBuffer();
		mVBuf->UnlockIndexBuffer();
	}
}